

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeMove(Parse *pParse,int iFrom,int iTo,int nReg)

{
  int iVar1;
  long lVar2;
  
  sqlite3VdbeAddOp3(pParse->pVdbe,0xd,iFrom,iTo,nReg + -1);
  lVar2 = 0;
  do {
    iVar1 = *(int *)((long)&pParse->aColCache[0].iReg + lVar2);
    if (iVar1 < nReg + iFrom && iFrom <= iVar1) {
      *(int *)((long)&pParse->aColCache[0].iReg + lVar2) = iVar1 + (iTo - iFrom);
    }
    lVar2 = lVar2 + 0x18;
  } while ((int)lVar2 != 0xf0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeMove(Parse *pParse, int iFrom, int iTo, int nReg){
  int i;
  struct yColCache *p;
  assert( iFrom>=iTo+nReg || iFrom+nReg<=iTo );
  sqlite3VdbeAddOp3(pParse->pVdbe, OP_Move, iFrom, iTo, nReg-1);
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    int x = p->iReg;
    if( x>=iFrom && x<iFrom+nReg ){
      p->iReg += iTo-iFrom;
    }
  }
}